

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_lan.c
# Opt level: O0

void olsrv2_lan_cleanup(void)

{
  list_entity *plVar1;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  olsrv2_lan_entry *e_it;
  olsrv2_lan_entry *entry;
  
  e_it = (olsrv2_lan_entry *)&_lan_tree.list_head.next[-3].prev;
  plVar1 = (_lan_tree.list_head.next)->next;
  while( true ) {
    __tempptr = (list_entity *)&plVar1[-3].prev;
    if ((e_it->_node).list.prev == _lan_tree.list_head.prev) break;
    _remove((char *)e_it);
    e_it = (olsrv2_lan_entry *)__tempptr;
    plVar1 = plVar1->next;
  }
  oonf_class_remove(&_lan_class);
  return;
}

Assistant:

void
olsrv2_lan_cleanup(void) {
  struct olsrv2_lan_entry *entry, *e_it;

  /* remove all originator entries */
  avl_for_each_element_safe(&_lan_tree, entry, _node, e_it) {
    _remove(entry);
  }

  /* remove class */
  oonf_class_remove(&_lan_class);
}